

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[33],char[15],unsigned_int,char[16],unsigned_long,char[22],unsigned_int,char[47]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char (*Args_1) [15],
          uint *Args_2,char (*Args_3) [16],unsigned_long *Args_4,char (*Args_5) [22],uint *Args_6,
          char (*Args_7) [47])

{
  stringstream local_1c8 [8];
  stringstream ss;
  unsigned_long *Args_local_4;
  char (*Args_local_3) [16];
  uint *Args_local_2;
  char (*Args_local_1) [15];
  char (*Args_local) [33];
  
  std::__cxx11::stringstream::stringstream(local_1c8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char[15],unsigned_int,char[16],unsigned_long,char[22],unsigned_int,char[47]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (char (*) [33])this,(char (*) [15])Args,(uint *)Args_1,(char (*) [16])Args_2,
             (unsigned_long *)Args_3,(char (*) [22])Args_4,(uint *)Args_5,(char (*) [47])Args_6);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}